

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20M303DLHC.cpp
# Opt level: O0

bool __thiscall RTIMUGD20M303DLHC::setAccelCTRL4(RTIMUGD20M303DLHC *this)

{
  bool bVar1;
  uchar ctrl4;
  RTIMUGD20M303DLHC *this_local;
  
  switch(((this->super_RTIMU).m_settings)->m_GD20M303DLHCAccelFsr) {
  case 0:
    this->m_accelScale = 6.25e-05;
    break;
  case 1:
    this->m_accelScale = 0.000125;
    break;
  case 2:
    this->m_accelScale = 0.00025;
    break;
  case 3:
    this->m_accelScale = 0.00075;
    break;
  default:
    fprintf(_stderr,"Illegal LSM303DLHC accel FSR code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_GD20M303DLHCAccelFsr);
    return false;
  }
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                             this->m_accelSlaveAddr,'#',
                             (char)(((this->super_RTIMU).m_settings)->m_GD20M303DLHCAccelFsr << 4) +
                             0x80,"Failed to set LSM303DLHC CTRL4");
  return bVar1;
}

Assistant:

bool RTIMUGD20M303DLHC::setAccelCTRL4()
{
    unsigned char ctrl4;

    switch (m_settings->m_GD20M303DLHCAccelFsr) {
    case LSM303DLHC_ACCEL_FSR_2:
        m_accelScale = (RTFLOAT)0.001 / (RTFLOAT)16;
        break;

    case LSM303DLHC_ACCEL_FSR_4:
        m_accelScale = (RTFLOAT)0.002 / (RTFLOAT)16;
        break;

    case LSM303DLHC_ACCEL_FSR_8:
        m_accelScale = (RTFLOAT)0.004 / (RTFLOAT)16;
        break;

    case LSM303DLHC_ACCEL_FSR_16:
        m_accelScale = (RTFLOAT)0.012 / (RTFLOAT)16;
        break;

    default:
        HAL_ERROR1("Illegal LSM303DLHC accel FSR code %d\n", m_settings->m_GD20M303DLHCAccelFsr);
        return false;
    }

    ctrl4 = 0x80 + (m_settings->m_GD20M303DLHCAccelFsr << 4);

    return m_settings->HALWrite(m_accelSlaveAddr,  LSM303DLHC_CTRL4_A, ctrl4, "Failed to set LSM303DLHC CTRL4");
}